

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_7.cpp
# Opt level: O0

int main(void)

{
  char cVar1;
  istream *this;
  ostream *this_00;
  int local_20;
  int i;
  int now;
  int R;
  int N;
  int m;
  
  N = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&now);
  std::istream::operator>>(this,&i);
  if (now < 0) {
    std::operator<<((ostream *)&std::cout,"-");
    now = -now;
  }
  R = 0;
  for (; now != 0; now = now / i) {
    cVar1 = (char)(now % i);
    if (now % i < 10) {
      num[R] = cVar1 + '0';
    }
    else {
      num[R] = cVar1 + '7';
    }
    R = R + 1;
  }
  if (R == 0) {
    std::ostream::operator<<((ostream *)&std::cout,0);
  }
  for (local_20 = R; 0 < local_20; local_20 = local_20 + -1) {
    this_00 = std::operator<<((ostream *)&std::cout,num[local_20]);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
    int m,N,R,now;
    std::cin >> N >> R;
    if(N < 0){
        std::cout << "-";
        N = -N;
    }
    m = 0;
    while (N)           //转换进制，先求余在，在除，最后倒序输出
    {
        now = N % R;
        if(now <= 9)
        {
            num[m++] = '0' + now; //'0'表示把数字转换成char类型的数字
        }else
        {
            num[m++] = 'A' + now - 10;  //把now转换成大写字母
        }
        N /= R;
    }
    if(m == 0)
    {
        std::cout << 0;
    }
    for (int i = m ; i > 0; i--) {     //进制转换以后要倒序输出，才是转换后的结果。
        std::cout << num[i] << std::endl;
    }
    return 0;
}